

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LEB128.cpp
# Opt level: O0

uint llvm::getULEB128Size(uint64_t Value)

{
  undefined4 local_14;
  uint64_t uStack_10;
  uint Size;
  uint64_t Value_local;
  
  local_14 = 0;
  uStack_10 = Value;
  do {
    uStack_10 = uStack_10 >> 7;
    local_14 = local_14 + 1;
  } while (uStack_10 != 0);
  return local_14;
}

Assistant:

unsigned getULEB128Size(uint64_t Value) {
  unsigned Size = 0;
  do {
    Value >>= 7;
    Size += sizeof(int8_t);
  } while (Value);
  return Size;
}